

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCore_impl.hpp
# Opt level: O0

bool __thiscall
helics::NetworkCore<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0>::brokerConnect
          (NetworkCore<helics::zeromq::ZmqComms,_(gmlc::networking::InterfaceTypes)0> *this)

{
  milliseconds timeOut;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  milliseconds mVar5;
  CommsInterface *this_00;
  socklen_t in_ECX;
  sockaddr *__addr;
  CommonCore *in_RDI;
  bool res;
  lock_guard<std::mutex> lock;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  CLI::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
             ,(mutex_type *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a9959);
  if (bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  }
  CLI::std::unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
  operator->((unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_> *
             )0x4a99a9);
  CommsInterface::setRequireBrokerConnection
            ((CommsInterface *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (bool)in_stack_ffffffffffffff9f);
  in_RDI[1].super_BrokerBase.actionQueue.m_pushLock.super___mutex_base._M_mutex.__size[2] =
       (in_RDI->super_BrokerBase).useJsonSerialization & 1;
  in_RDI[1].super_BrokerBase.actionQueue.m_pushLock.super___mutex_base._M_mutex.__size[3] =
       (in_RDI->super_BrokerBase).observer & 1;
  CLI::std::unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
  operator->((unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_> *
             )0x4a99e5);
  CommonCore::getIdentifier_abi_cxx11_(in_RDI);
  CommsInterface::setName
            ((CommsInterface *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (string *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  CLI::std::unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
  operator->((unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_> *
             )0x4a9a1d);
  zeromq::ZmqComms::loadNetworkInfo
            ((ZmqComms *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (NetworkBrokerData *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  CLI::std::unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
  operator->((unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_> *
             )0x4a9a44);
  mVar5 = TimeRepresentation<count_time<9,_long>_>::to_ms
                    ((TimeRepresentation<count_time<9,_long>_> *)
                     CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  iVar4 = (int)mVar5.__r;
  timeOut.__r._4_4_ = in_stack_ffffffffffffffa4;
  timeOut.__r._0_4_ = in_stack_ffffffffffffffa0;
  CommsInterface::setTimeout
            ((CommsInterface *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),timeOut
            );
  this_00 = (CommsInterface *)
            CLI::std::
            unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
            operator->((unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>
                        *)0x4a9a8a);
  uVar3 = CommsInterface::connect(this_00,iVar4,__addr,in_ECX);
  bVar2 = (byte)uVar3 & 1;
  if (((uVar3 & 1) != 0) &&
     (iVar4._0_1_ = in_RDI[1].super_BrokerBase.haltOperations,
     iVar4._1_1_ = in_RDI[1].super_BrokerBase.restrictive_time_policy,
     iVar4._2_1_ = in_RDI[1].super_BrokerBase.terminate_on_error,
     iVar4._3_1_ = in_RDI[1].super_BrokerBase.debugging, iVar4 < 0)) {
    CLI::std::unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>::
    operator->((unique_ptr<helics::zeromq::ZmqComms,_std::default_delete<helics::zeromq::ZmqComms>_>
                *)0x4a9ac8);
    iVar4 = NetworkCommsInterface::getPort((NetworkCommsInterface *)0x4a9ad0);
    in_RDI[1].super_BrokerBase.haltOperations = (atomic<bool>)(char)iVar4;
    in_RDI[1].super_BrokerBase.restrictive_time_policy = (bool)(char)((uint)iVar4 >> 8);
    in_RDI[1].super_BrokerBase.terminate_on_error = (bool)(char)((uint)iVar4 >> 0x10);
    in_RDI[1].super_BrokerBase.debugging = (bool)(char)((uint)iVar4 >> 0x18);
  }
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x4a9af9);
  return (bool)(bVar2 & 1);
}

Assistant:

bool NetworkCore<COMMS, baseline>::brokerConnect()
{
    std::lock_guard<std::mutex> lock(dataMutex);
    if (netInfo.brokerAddress.empty())  // cores require a broker
    {
        netInfo.brokerAddress = defBrokerInterface[static_cast<int>(baseline)];
    }
    CommsBroker<COMMS, CommonCore>::comms->setRequireBrokerConnection(true);
    netInfo.useJsonSerialization = BrokerBase::useJsonSerialization;
    netInfo.observer = BrokerBase::observer;
    CommsBroker<COMMS, CommonCore>::comms->setName(CommonCore::getIdentifier());
    CommsBroker<COMMS, CommonCore>::comms->loadNetworkInfo(netInfo);
    CommsBroker<COMMS, CommonCore>::comms->setTimeout(BrokerBase::networkTimeout.to_ms());
    auto res = CommsBroker<COMMS, CommonCore>::comms->connect();
    if (res) {
        if (netInfo.portNumber < 0) {
            netInfo.portNumber = CommsBroker<COMMS, CommonCore>::comms->getPort();
        }
    }
    return res;
}